

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_intersect(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  vm_val_t val2;
  
  if (getp_intersect(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar4 = __cxa_guard_acquire(&getp_intersect(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                 ::desc);
    if (iVar4 != 0) {
      getp_intersect::desc.min_argc_ = 1;
      getp_intersect::desc.opt_argc_ = 0;
      getp_intersect::desc.varargs_ = 0;
      __cxa_guard_release(&getp_intersect(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                         );
    }
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_intersect::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    val2.typ = sp_[-1].typ;
    val2._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    val2.val = sp_[-1].val;
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    vVar5 = intersect(self_val,&val2);
    sp_ = sp_ + -2;
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_intersect(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *lst, uint *argc)
{
    vm_val_t val2;
    vm_obj_id_t obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the second list, but leave it on the stack for GC protection */
    val2 = *G_stk->get(0);

    /* put myself on the stack for GC protection as well */
    G_stk->push(self_val);

    /* compute the intersection */
    obj = intersect(vmg_ self_val, &val2);

    /* discard the argument lists */
    G_stk->discard(2);

    /* return the new object */
    retval->set_obj(obj);

    /* handled */
    return TRUE;
}